

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkQueryUtil.cpp
# Opt level: O0

vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *
vk::enumerateDeviceLayerProperties
          (vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>
           *__return_storage_ptr__,InstanceInterface *vki,VkPhysicalDevice physicalDevice)

{
  VkPhysicalDevice pVVar1;
  VkPhysicalDevice pVVar2;
  VkResult VVar3;
  deBool dVar4;
  reference pvVar5;
  ulong uVar6;
  size_type sVar7;
  TestError *this;
  uint local_28;
  undefined1 local_21;
  deUint32 numLayers;
  VkPhysicalDevice physicalDevice_local;
  InstanceInterface *vki_local;
  vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *properties;
  
  local_21 = 0;
  _numLayers = physicalDevice;
  physicalDevice_local = (VkPhysicalDevice)vki;
  vki_local = (InstanceInterface *)__return_storage_ptr__;
  std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>::vector
            (__return_storage_ptr__);
  local_28 = 0;
  VVar3 = (**(code **)(*(long *)physicalDevice_local + 0x58))
                    (physicalDevice_local,_numLayers,&local_28,0);
  checkResult(VVar3,"vki.enumerateDeviceLayerProperties(physicalDevice, &numLayers, DE_NULL)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkQueryUtil.cpp"
              ,0xd3);
  if (local_28 != 0) {
    std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>::resize
              (__return_storage_ptr__,(ulong)local_28);
    pVVar2 = physicalDevice_local;
    pVVar1 = _numLayers;
    pvVar5 = std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>::operator[]
                       (__return_storage_ptr__,0);
    VVar3 = (**(code **)(*(long *)pVVar2 + 0x58))(pVVar2,pVVar1,&local_28,pvVar5);
    checkResult(VVar3,
                "vki.enumerateDeviceLayerProperties(physicalDevice, &numLayers, &properties[0])",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkQueryUtil.cpp"
                ,0xd8);
    do {
      dVar4 = ::deGetFalse();
      if ((dVar4 != 0) ||
         (uVar6 = (ulong)local_28,
         sVar7 = std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>::size
                           (__return_storage_ptr__), uVar6 != sVar7)) {
        this = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this,(char *)0x0,"(size_t)numLayers == properties.size()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkQueryUtil.cpp"
                   ,0xd9);
        __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<VkLayerProperties> enumerateDeviceLayerProperties (const InstanceInterface& vki, VkPhysicalDevice physicalDevice)
{
	vector<VkLayerProperties>	properties;
	deUint32					numLayers	= 0;

	VK_CHECK(vki.enumerateDeviceLayerProperties(physicalDevice, &numLayers, DE_NULL));

	if (numLayers > 0)
	{
		properties.resize(numLayers);
		VK_CHECK(vki.enumerateDeviceLayerProperties(physicalDevice, &numLayers, &properties[0]));
		TCU_CHECK((size_t)numLayers == properties.size());
	}

	return properties;
}